

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O0

string * __thiscall
tinyusdz::Attribute::type_name_abi_cxx11_(string *__return_storage_ptr__,Attribute *this)

{
  bool bVar1;
  long lVar2;
  Attribute *this_local;
  
  lVar2 = std::__cxx11::string::size();
  if (lVar2 == 0) {
    bVar1 = is_connection(this);
    if (bVar1) {
      std::__cxx11::string::string((string *)__return_storage_ptr__);
    }
    else {
      primvar::PrimVar::type_name_abi_cxx11_(__return_storage_ptr__,&this->_var);
    }
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->_type_name);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string type_name() const {
    if (_type_name.size()) {
      return _type_name;
    }

    if (!is_connection()) {
      // Fallback. May be unreliable(`var` could be empty).
      return _var.type_name();
    }

    return std::string();
  }